

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ConcatNDLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_concatnd(NeuralNetworkLayer *this)

{
  bool bVar1;
  ConcatNDLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_concatnd(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_concatnd(this);
    this_00 = (ConcatNDLayerParams *)operator_new(0x20);
    ConcatNDLayerParams::ConcatNDLayerParams(this_00);
    (this->layer_).concatnd_ = this_00;
  }
  return (ConcatNDLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ConcatNDLayerParams* NeuralNetworkLayer::mutable_concatnd() {
  if (!has_concatnd()) {
    clear_layer();
    set_has_concatnd();
    layer_.concatnd_ = new ::CoreML::Specification::ConcatNDLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.concatND)
  return layer_.concatnd_;
}